

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int srcReg,u8 flags)

{
  Vdbe *p;
  Expr *p_00;
  byte bVar1;
  int iVar2;
  VdbeOp *pVVar3;
  uint uVar4;
  uint target_00;
  byte bVar5;
  int iVar6;
  int iVar7;
  anon_union_4_2_6146edf4_for_u *paVar8;
  
  bVar1 = flags & 1 ^ 0x4f;
  p = pParse->pVdbe;
  iVar6 = pList->nExpr;
  bVar5 = flags & 0xfd;
  if (pParse->okConstFactor != '\0') {
    bVar5 = flags;
  }
  pVVar3 = (VdbeOp *)(ulong)bVar1;
  paVar8 = &pList->a[0].u;
  iVar7 = 0;
  do {
    if (iVar6 <= iVar7) {
      return (int)pVVar3;
    }
    p_00 = ((ExprList_item *)(paVar8 + -7))->pExpr;
    if (((bVar5 & 4) == 0) || ((paVar8->x).iOrderByCol == 0)) {
      if (((bVar5 & 2) == 0) || (iVar2 = sqlite3ExprIsConstantNotJoin(p_00), iVar2 == 0)) {
        target_00 = iVar7 + target;
        uVar4 = sqlite3ExprCodeTarget(pParse,p_00,target_00);
        pVVar3 = (VdbeOp *)(ulong)uVar4;
        if (uVar4 != target_00) {
          if (((((flags & 1) == 0) || (pVVar3 = sqlite3VdbeGetOp(p,-1), pVVar3->opcode != 'N')) ||
              (iVar2 = pVVar3->p3 + 1, pVVar3->p1 + iVar2 != uVar4)) ||
             (pVVar3->p2 + iVar2 != target_00)) goto LAB_0018e340;
          pVVar3->p3 = iVar2;
        }
      }
      else {
        uVar4 = sqlite3ExprCodeAtInit(pParse,p_00,iVar7 + target);
        pVVar3 = (VdbeOp *)(ulong)uVar4;
      }
    }
    else if ((bVar5 & 8) == 0) {
      uVar4 = (uint)(paVar8->x).iOrderByCol + srcReg + -1;
LAB_0018e340:
      uVar4 = sqlite3VdbeAddOp2(p,(uint)bVar1,uVar4,iVar7 + target);
      pVVar3 = (VdbeOp *)(ulong)uVar4;
    }
    else {
      iVar7 = iVar7 + -1;
      iVar6 = iVar6 + -1;
    }
    iVar7 = iVar7 + 1;
    paVar8 = paVar8 + 8;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int srcReg,        /* Source registers if SQLITE_ECEL_REF */
  u8 flags           /* SQLITE_ECEL_* flags */
){
  struct ExprList_item *pItem;
  int i, j, n;
  u8 copyOp = (flags & SQLITE_ECEL_DUP) ? OP_Copy : OP_SCopy;
  Vdbe *v = pParse->pVdbe;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  if( !ConstFactorOk(pParse) ) flags &= ~SQLITE_ECEL_FACTOR;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( pItem->bSorterRef ){
      i--;
      n--;
    }else
#endif
    if( (flags & SQLITE_ECEL_REF)!=0 && (j = pItem->u.x.iOrderByCol)>0 ){
      if( flags & SQLITE_ECEL_OMITREF ){
        i--;
        n--;
      }else{
        sqlite3VdbeAddOp2(v, copyOp, j+srcReg-1, target+i);
      }
    }else if( (flags & SQLITE_ECEL_FACTOR)!=0
           && sqlite3ExprIsConstantNotJoin(pExpr)
    ){
      sqlite3ExprCodeAtInit(pParse, pExpr, target+i);
    }else{
      int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
      if( inReg!=target+i ){
        VdbeOp *pOp;
        if( copyOp==OP_Copy
         && (pOp=sqlite3VdbeGetOp(v, -1))->opcode==OP_Copy
         && pOp->p1+pOp->p3+1==inReg
         && pOp->p2+pOp->p3+1==target+i
        ){
          pOp->p3++;
        }else{
          sqlite3VdbeAddOp2(v, copyOp, inReg, target+i);
        }
      }
    }
  }
  return n;
}